

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quoted.cpp
# Opt level: O1

void __thiscall Quoted_Simple_Test::TestBody(Quoted_Simple_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  stringstream str;
  AssertHelper AStack_1c8;
  internal local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  basic_ostream<char,_std::char_traits<char>_> local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_1b0._M_dataplus._M_p = "simple";
  local_1b0._M_string_length._0_2_ = 0x22;
  std::__detail::operator<<(local_180,(_Quoted_string<const_char_*,_char> *)&local_1b0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            (local_1c0,"str.str ()","R\"(\"simple\")\"",&local_1b0,(char (*) [9])"\"simple\"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      message = (local_1b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_quoted.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b8,local_1b8);
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST (Quoted, Simple) {
    std::stringstream str;
    str << pstore::quoted ("simple");
    EXPECT_EQ (str.str (), R"("simple")");
}